

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_pointcloud.cpp
# Opt level: O1

bool __thiscall ON_PointCloud::PointIsHidden(ON_PointCloud *this,int point_index)

{
  int iVar1;
  undefined1 uVar2;
  
  if (-1 < point_index) {
    iVar1 = (this->m_P).super_ON_SimpleArray<ON_3dPoint>.m_count;
    uVar2 = 0;
    if ((point_index < iVar1) && (uVar2 = 0, (this->m_H).m_count == iVar1)) {
      uVar2 = (this->m_H).m_a[(uint)point_index];
    }
    return (bool)uVar2;
  }
  return false;
}

Assistant:

bool ON_PointCloud::PointIsHidden( int point_index ) const
{
  int point_count;
  return (    point_index >= 0
           && point_index < (point_count = m_P.Count())
           && m_H.Count() == point_count )
           ? m_H[point_index]
           : false;
}